

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.h
# Opt level: O2

void __thiscall
hedg::Stream_Client::
send<boost::asio::basic_streambuf<std::allocator<char>>&,hedg::params::stream_authenticate>
          (Stream_Client *this,
          _func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_authenticate *f,
          stream_authenticate *p)

{
  streambuf *b;
  string in_stack_ffffffffffffffb8;
  
  b = &(this->super_Client<hedg::Stream_Client>).inp_buff_;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)p);
  (*f)(b,(stream_authenticate)in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  boost::asio::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
            (&(this->super_Client<hedg::Stream_Client>).sock_,b);
  return;
}

Assistant:

void send(void(*f)(Buff, T), T p) {
		f(inp_buff_, p);
		boost::asio::write(sock_, inp_buff_);
	}